

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult *
Catch::clara::detail::
invokeLambda<std::__cxx11::string,Catch::makeCommandLineParser(Catch::ConfigData&)::__8>
          (anon_class_8_1_50637480_for_m_lambda *lambda,string *arg)

{
  bool bVar1;
  BasicResult<Catch::clara::detail::ParseResultType> *in_RDI;
  ParserResult result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  BasicResult<Catch::clara::detail::ParseResultType> *lambda_00;
  BasicResult<Catch::clara::detail::ParseResultType> *this;
  string *in_stack_ffffffffffffff88;
  BasicResult local_68 [48];
  BasicResult<Catch::clara::detail::ParseResultType> local_38;
  
  this = &local_38;
  lambda_00 = in_RDI;
  ::std::__cxx11::string::string((string *)this);
  convertInto(in_stack_ffffffffffffff88,(string *)this);
  bVar1 = BasicResult::operator_cast_to_bool(local_68);
  if (bVar1) {
    LambdaInvoker<Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>>::
    invoke<Catch::makeCommandLineParser(Catch::ConfigData&)::__8,std::__cxx11::string>
              ((anon_class_8_1_50637480_for_m_lambda *)lambda_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  }
  else {
    BasicResult<Catch::clara::detail::ParseResultType>::BasicResult(this,lambda_00);
  }
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(in_RDI);
  ::std::__cxx11::string::~string((string *)&local_38);
  return lambda_00;
}

Assistant:

inline auto invokeLambda( L const &lambda, std::string const &arg ) -> ParserResult {
        ArgType temp{};
        auto result = convertInto( arg, temp );
        return !result
           ? result
           : LambdaInvoker<typename UnaryLambdaTraits<L>::ReturnType>::invoke( lambda, temp );
    }